

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,Register8Bits dest,ExtendedRegisters srcMemReg,int offset)

{
  undefined8 in_RAX;
  size_t i;
  long lVar1;
  IntToBytes converter;
  undefined8 local_28;
  
  local_28._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  local_28._0_3_ = (undefined3)in_RAX;
  local_28._0_4_ = CONCAT13(0x41,(undefined3)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,(uchar *)((long)&local_28 + 3));
  local_28._0_3_ = CONCAT12(0x8a,(undefined2)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,(uchar *)((long)&local_28 + 2));
  local_28 = CONCAT62(local_28._2_6_,CONCAT11(dest << 3 | srcMemReg,(undefined1)local_28)) | 0x8000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,(uchar *)((long)&local_28 + 1));
  local_28 = CONCAT44(offset,(undefined4)local_28);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_28 + lVar1 + 4));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, Register8Bits dest, ExtendedRegisters srcMemReg, int offset) {
		codeGen.push_back(0x41);
		codeGen.push_back(0x8a);
		codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}